

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StacktraceFunc::~StacktraceFunc(StacktraceFunc *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~StacktraceFunc((StacktraceFunc *)0xb06548);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

StacktraceFunc() : SystemSubroutine(KnownSystemName::Stacktrace, SubroutineKind::Function) {}